

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterate.cc
# Opt level: O2

void __thiscall ipx::Iterate::ResidualsFromDropping(Iterate *this,double *pres,double *dres)

{
  int *piVar1;
  double dVar2;
  StateDetail SVar3;
  Model *pMVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  double *pdVar9;
  pointer piVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  double *pdVar15;
  long lVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  
  pMVar4 = this->model_;
  pdVar5 = (this->x_)._M_data;
  uVar12 = pMVar4->num_cols_ + pMVar4->num_rows_;
  pdVar6 = (this->zl_)._M_data;
  pdVar7 = (this->xl_)._M_data;
  pdVar8 = (this->zu_)._M_data;
  pdVar9 = (this->xu_)._M_data;
  uVar14 = 0;
  uVar13 = (ulong)uVar12;
  if ((int)uVar12 < 1) {
    uVar13 = uVar14;
  }
  dVar18 = 0.0;
  dVar20 = 0.0;
  do {
    dVar17 = dVar20;
    if (uVar14 == uVar13) {
      if (pres != (double *)0x0) {
        *pres = dVar18;
      }
      if (dres != (double *)0x0) {
        *dres = dVar17;
      }
      return;
    }
    SVar3 = (this->variable_state_).
            super__Vector_base<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar14];
    dVar19 = 0.0;
    if (SVar3 == BARRIER_BOXED) {
      dVar20 = pdVar6[uVar14];
      dVar21 = pdVar7[uVar14];
      dVar22 = pdVar8[uVar14];
      dVar2 = pdVar9[uVar14];
      auVar23._8_8_ = dVar22;
      auVar23._0_8_ = dVar20;
      auVar24._8_8_ = dVar2;
      auVar24._0_8_ = dVar21;
      auVar24 = divpd(auVar23,auVar24);
      if (auVar24._8_8_ <= auVar24._0_8_) {
        if (dVar21 <= dVar20) {
LAB_0037f333:
          dVar20 = pdVar5[uVar14];
          pdVar15 = (pMVar4->lb_)._M_data;
          goto LAB_0037f340;
        }
      }
      else if (dVar2 <= dVar22) goto LAB_0037f310;
      dVar19 = dVar20 - dVar22;
LAB_0037f329:
      dVar20 = 0.0;
    }
    else {
      if (SVar3 == BARRIER_UB) {
        if (pdVar9[uVar14] <= pdVar8[uVar14]) {
LAB_0037f310:
          dVar20 = pdVar5[uVar14];
          pdVar15 = (pMVar4->ub_)._M_data;
LAB_0037f340:
          dVar20 = dVar20 - pdVar15[uVar14];
          goto LAB_0037f346;
        }
        dVar19 = pdVar6[uVar14] - pdVar8[uVar14];
      }
      else if (SVar3 == BARRIER_LB) {
        if (pdVar7[uVar14] <= pdVar6[uVar14]) goto LAB_0037f333;
        dVar19 = pdVar6[uVar14] - pdVar8[uVar14];
        goto LAB_0037f329;
      }
      dVar20 = 0.0;
    }
LAB_0037f346:
    piVar10 = (pMVar4->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar1 = piVar10 + uVar14;
    lVar11 = uVar14 + 1;
    uVar14 = uVar14 + 1;
    dVar21 = 0.0;
    for (lVar16 = (long)*piVar1; lVar16 < piVar10[lVar11]; lVar16 = lVar16 + 1) {
      dVar22 = ABS((pMVar4->AI_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start[lVar16]);
      if (dVar22 <= dVar21) {
        dVar22 = dVar21;
      }
      dVar21 = dVar22;
    }
    dVar22 = ABS(dVar20) * dVar21;
    if (ABS(dVar20) * dVar21 <= dVar18) {
      dVar22 = dVar18;
    }
    dVar18 = dVar22;
    dVar20 = ABS(dVar19);
    if (ABS(dVar19) <= dVar17) {
      dVar20 = dVar17;
    }
  } while( true );
}

Assistant:

void Iterate::ResidualsFromDropping(double* pres, double* dres) const {
    const Int m = model_.rows();
    const Int n = model_.cols();
    const SparseMatrix& AI = model_.AI();
    const Vector& lb = model_.lb();
    const Vector& ub = model_.ub();
    double presmax = 0.0;
    double dresmax = 0.0;

    for (Int j = 0; j < n+m; j++) {
        double xdrop = 0.0;     // xnew = xold - xdrop
        double zdrop = 0.0;
        switch (variable_state_[j]) {
        case StateDetail::BARRIER_LB:
            if (zl_[j] >= xl_[j])
                xdrop = x_[j]-lb[j];   // active at lower bound
            else
                zdrop = zl_[j]-zu_[j]; // inactive
            break;
        case StateDetail::BARRIER_UB:
            if (zu_[j] >= xu_[j])
                xdrop = x_[j]-ub[j];   // active at upper bound
            else
                zdrop = zl_[j]-zu_[j]; // inactive
            break;
        case StateDetail::BARRIER_BOXED:
            if (zl_[j]/xl_[j] >= zu_[j]/xu_[j]) {
                if (zl_[j] >= xl_[j])
                    xdrop = x_[j]-lb[j];   // active at lower bound
                else
                    zdrop = zl_[j]-zu_[j]; // inactive
            } else {
                if (zu_[j] >= xu_[j])
                    xdrop = x_[j]-ub[j];   // active at upper bound
                else
                    zdrop = zl_[j]-zu_[j]; // inactive
            }
            break;
        default: ;
        }
        double amax = 0.0;
        for (Int p = AI.begin(j); p < AI.begin(j+1); p++)
            amax = std::max(amax, std::abs(AI.value(p)));
        presmax = std::max(presmax, std::abs(xdrop) * amax);
        dresmax = std::max(dresmax, std::abs(zdrop));
    }
    if (pres)
        *pres = presmax;
    if (dres)
        *dres = dresmax;
}